

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

fio_str_info_s *
fio_str_concat(fio_str_info_s *__return_storage_ptr__,fio_str_s *dest,fio_str_s *src)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  uint8_t *__src;
  uint64_t uVar6;
  ulong uVar7;
  fio_str_info_s local_40;
  
  if ((src == (fio_str_s *)0x0 || dest == (fio_str_s *)0x0) || (dest->frozen != '\0')) {
    if (dest == (fio_str_s *)0x0) {
LAB_0013e45e:
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 0;
      __return_storage_ptr__->data = (char *)0x0;
      return __return_storage_ptr__;
    }
    uVar7 = (ulong)dest->small;
    if ((uVar7 != 0) || (pcVar4 = dest->data, pcVar4 == (char *)0x0)) {
      sVar5 = 0x29;
      if (dest->frozen != '\0') {
        sVar5 = 0;
      }
      __return_storage_ptr__->capa = sVar5;
LAB_0013e3d7:
      __return_storage_ptr__->len = uVar7 >> 1;
      __return_storage_ptr__->data = (char *)dest->reserved;
      return __return_storage_ptr__;
    }
    if (dest->frozen != '\0') {
      uVar2 = 0;
      goto LAB_0013e532;
    }
  }
  else {
    if ((src->small == 0) && (__src = (uint8_t *)src->data, __src != (uint8_t *)0x0)) {
      uVar2 = src->len;
    }
    else {
      uVar2 = (uint64_t)(src->small >> 1);
      __src = src->reserved;
    }
    if (uVar2 != 0) {
      bVar1 = dest->small;
      if ((bVar1 == 0) && (dest->data != (char *)0x0)) {
        uVar6 = dest->len;
      }
      else {
        uVar6 = (uint64_t)(bVar1 >> 1);
      }
      uVar7 = uVar6 + uVar2;
      if ((bVar1 == 0) && (dest->data != (char *)0x0)) {
        uVar3 = dest->capa;
        if (uVar3 <= uVar7) {
          if (dest->dealloc == (_func_void_void_ptr *)0x0) {
            uVar3 = dest->len;
          }
          dest->len = uVar3;
          goto LAB_0013e4d9;
        }
      }
      else {
        if (uVar7 < 0x2a) {
          dest->small = (char)uVar7 * '\x02' + '\x01';
          dest->reserved[uVar7] = '\0';
          __return_storage_ptr__->capa = 0x29;
          __return_storage_ptr__->len = uVar7;
          __return_storage_ptr__->data = (char *)dest->reserved;
          goto LAB_0013e509;
        }
        dest->small = 'S';
LAB_0013e4d9:
        fio_str_capa_assert(&local_40,dest,uVar7);
      }
      dest->len = uVar7;
      dest->data[uVar7] = '\0';
      __return_storage_ptr__->capa = dest->capa;
      __return_storage_ptr__->len = uVar7;
      __return_storage_ptr__->data = dest->data;
LAB_0013e509:
      memcpy(__return_storage_ptr__->data + (__return_storage_ptr__->len - uVar2),__src,uVar2);
      return __return_storage_ptr__;
    }
    if (dest == (fio_str_s *)0x0) goto LAB_0013e45e;
    uVar7 = (ulong)dest->small;
    if ((uVar7 != 0) || (pcVar4 = dest->data, pcVar4 == (char *)0x0)) {
      __return_storage_ptr__->capa = 0x29;
      goto LAB_0013e3d7;
    }
  }
  uVar2 = dest->capa;
LAB_0013e532:
  __return_storage_ptr__->capa = uVar2;
  __return_storage_ptr__->len = dest->len;
  __return_storage_ptr__->data = pcVar4;
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_concat(fio_str_s *dest,
                                              fio_str_s const *src) {
  if (!dest || !src || dest->frozen)
    return fio_str_info(dest);
  fio_str_info_s src_state = fio_str_info(src);
  if (!src_state.len)
    return fio_str_info(dest);
  fio_str_info_s state =
      fio_str_resize(dest, src_state.len + fio_str_len(dest));
  memcpy(state.data + state.len - src_state.len, src_state.data, src_state.len);
  return state;
}